

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  Option *in_stack_00000d68;
  Mat *in_stack_00000d70;
  Mat *in_stack_00000d78;
  Mat *in_stack_00000d80;
  
  im2col_sgemm_pack8to1_int8_sse
            (in_stack_00000d80,in_stack_00000d78,in_stack_00000d70,in_stack_00000d68);
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}